

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimvcd.cpp
# Opt level: O2

void __thiscall BtorSimVCDWriter::update_time(BtorSimVCDWriter *this,int64_t k)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  int iVar2;
  int64_t id;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  long __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  long local_40;
  int64_t local_38;
  
  if (this->current_step < k) {
    if (k < 1) {
      __val = k * 10;
    }
    else {
      std::__cxx11::to_string(&local_60,k * 10 + -5);
      std::operator+(&local_80,"#",&local_60);
      pvVar1 = &this->value_changes;
      local_40 = k * 10;
      local_38 = k;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                 &local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_60);
      for (p_Var3 = (this->clocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          __val = local_40, k = local_38,
          (_Rb_tree_header *)p_Var3 != &(this->clocks)._M_t._M_impl.super__Rb_tree_header;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        if (*(int *)&p_Var3[1]._M_parent == 1) {
          get_bv_identifier_abi_cxx11_(&local_60,this,*(int64_t *)(p_Var3 + 1));
          std::operator+(&local_80,"1",&local_60);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                     &local_80);
LAB_0010e988:
          std::__cxx11::string::~string((string *)&local_80);
          std::__cxx11::string::~string((string *)&local_60);
        }
        else if (*(int *)&p_Var3[1]._M_parent == 0) {
          get_bv_identifier_abi_cxx11_(&local_60,this,*(int64_t *)(p_Var3 + 1));
          std::operator+(&local_80,"0",&local_60);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                     &local_80);
          goto LAB_0010e988;
        }
      }
    }
    std::__cxx11::to_string(&local_60,__val);
    std::operator+(&local_80,"#",&local_60);
    pvVar1 = &this->value_changes;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,&local_80
              );
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    this->current_step = k;
    for (p_Var4 = (this->clocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->clocks)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      id = *(int64_t *)(p_Var4 + 1);
      iVar2 = *(int *)&p_Var4[1]._M_parent;
      if (iVar2 == 2) {
        get_bv_identifier_abi_cxx11_(&local_60,this,id);
        std::operator+(&local_80,"1",&local_60);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                   &local_80);
LAB_0010eaba:
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
      }
      else {
        if (iVar2 == 1) {
          get_bv_identifier_abi_cxx11_(&local_60,this,id);
          std::operator+(&local_80,"0",&local_60);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                     &local_80);
          goto LAB_0010eaba;
        }
        if (iVar2 == 0) {
          get_bv_identifier_abi_cxx11_(&local_60,this,id);
          std::operator+(&local_80,"1",&local_60);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
                     &local_80);
          goto LAB_0010eaba;
        }
      }
    }
  }
  return;
}

Assistant:

void
BtorSimVCDWriter::update_time (int64_t k)
{
  if (current_step < k)
  {
    if (k > 0)
    {
      value_changes.push_back ("#" + std::to_string (k * 10 - 5));
      for (auto clk : clocks)
      {
        switch (clk.second)
        {
          case POSEDGE:
            value_changes.push_back ("0" + get_bv_identifier (clk.first));
            break;
          case NEGEDGE:
            value_changes.push_back ("1" + get_bv_identifier (clk.first));
            break;
          case EVENT: break;
        }
      }
    }
    value_changes.push_back ("#" + std::to_string (k * 10));
    current_step = k;
    for (auto clk : clocks)
    {
      switch (clk.second)
      {
        case POSEDGE:
          value_changes.push_back ("1" + get_bv_identifier (clk.first));
          break;
        case NEGEDGE:
          value_changes.push_back ("0" + get_bv_identifier (clk.first));
          break;
        case EVENT:
          value_changes.push_back ("1" + get_bv_identifier (clk.first));
          break;
      }
    }
  }
}